

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeTreeInterfaces.cpp
# Opt level: O0

bool __thiscall
Indexing::CodeTreeTIS<Indexing::DemodulatorData>::ResultIterator::hasNext(ResultIterator *this)

{
  long lVar1;
  long lVar2;
  long lVar3;
  DemodulatorData *pDVar4;
  TermMatcher *in_RDI;
  bool local_1;
  
  lVar1._0_1_ = (in_RDI->super_Matcher)._fresh;
  lVar1._1_1_ = (in_RDI->super_Matcher)._matched;
  lVar1._2_6_ = *(undefined6 *)&(in_RDI->super_Matcher).field_0x32;
  if (lVar1 == 0) {
    if (((in_RDI->super_Matcher).btStack._capacity & 1) == 0) {
      Lib::
      Recycled<Indexing::TermCodeTree<Indexing::DemodulatorData>::TermMatcher,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
      ::operator->((Recycled<Indexing::TermCodeTree<Indexing::DemodulatorData>::TermMatcher,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                    *)0x35300e);
      pDVar4 = TermCodeTree<Indexing::DemodulatorData>::TermMatcher::next(in_RDI);
      *(DemodulatorData **)&(in_RDI->super_Matcher)._fresh = pDVar4;
      lVar2._0_1_ = (in_RDI->super_Matcher)._fresh;
      lVar2._1_1_ = (in_RDI->super_Matcher)._matched;
      lVar2._2_6_ = *(undefined6 *)&(in_RDI->super_Matcher).field_0x32;
      if (lVar2 == 0) {
        *(undefined1 *)&(in_RDI->super_Matcher).btStack._capacity = 1;
      }
      lVar3._0_1_ = (in_RDI->super_Matcher)._fresh;
      lVar3._1_1_ = (in_RDI->super_Matcher)._matched;
      lVar3._2_6_ = *(undefined6 *)&(in_RDI->super_Matcher).field_0x32;
      local_1 = lVar3 != 0;
    }
    else {
      local_1 = false;
    }
  }
  else {
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool hasNext()
  {
    if(_found) {
      return true;
    }
    if(_finished) {
      return false;
    }
    _found = _matcher->next();
    if(!_found) {
      _finished=true;
    }
    return _found;
  }